

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

void xmlRegisterCharEncodingHandler(xmlCharEncodingHandlerPtr handler)

{
  long lVar1;
  
  if (handlers == (xmlCharEncodingHandlerPtr *)0x0) {
    xmlInitCharEncodingHandlers();
  }
  if (handlers == (xmlCharEncodingHandlerPtr *)0x0 || handler == (xmlCharEncodingHandlerPtr)0x0) {
    xmlEncodingErr(XML_I18N_NO_HANDLER,"xmlRegisterCharEncodingHandler: NULL handler !\n",
                   (char *)0x0);
    if (handler != (xmlCharEncodingHandlerPtr)0x0) {
LAB_00142973:
      if (handler->name != (char *)0x0) {
        (*xmlFree)(handler->name);
      }
      (*xmlFree)(handler);
      return;
    }
  }
  else {
    lVar1 = (long)nbCharEncodingHandler;
    if (0x31 < lVar1) {
      xmlEncodingErr(XML_I18N_EXCESS_HANDLER,
                     "xmlRegisterCharEncodingHandler: Too many handler registered, see %s\n",
                     "MAX_ENCODING_HANDLERS");
      goto LAB_00142973;
    }
    nbCharEncodingHandler = nbCharEncodingHandler + 1;
    handlers[lVar1] = handler;
  }
  return;
}

Assistant:

void
xmlRegisterCharEncodingHandler(xmlCharEncodingHandlerPtr handler) {
    if (handlers == NULL) xmlInitCharEncodingHandlers();
    if ((handler == NULL) || (handlers == NULL)) {
        xmlEncodingErr(XML_I18N_NO_HANDLER,
		"xmlRegisterCharEncodingHandler: NULL handler !\n", NULL);
        goto free_handler;
    }

    if (nbCharEncodingHandler >= MAX_ENCODING_HANDLERS) {
        xmlEncodingErr(XML_I18N_EXCESS_HANDLER,
	"xmlRegisterCharEncodingHandler: Too many handler registered, see %s\n",
	               "MAX_ENCODING_HANDLERS");
        goto free_handler;
    }
    handlers[nbCharEncodingHandler++] = handler;
    return;

free_handler:
    if (handler != NULL) {
        if (handler->name != NULL) {
            xmlFree(handler->name);
        }
        xmlFree(handler);
    }
}